

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O2

void StdSprintf<short>(void)

{
  long lVar1;
  ostream *poVar2;
  int iVar3;
  char local_88 [8];
  char buf [64];
  undefined1 local_40 [8];
  Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> _prof;
  ResultType _result;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"[");
  poVar2 = std::operator<<(poVar2,_operator_delete + (*_operator_delete == '*'));
  poVar2 = std::operator<<(poVar2,"] ");
  poVar2 = std::operator<<(poVar2,"sprintf");
  std::operator<<(poVar2,"... ");
  std::ostream::flush();
  local_40 = (undefined1  [8])&_prof.mStart;
  _prof.mResult = (duration<double,_std::ratio<1L,_1L>_> *)std::chrono::_V2::steady_clock::now();
  for (iVar3 = -0xffff; iVar3 != 0; iVar3 = iVar3 + 1) {
    sprintf(local_88,"%hd",(ulong)(iVar3 + 0x7fff));
  }
  Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>::~Profiler
            ((Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> *)local_40);
  lVar1 = std::cout;
  *(uint *)(std::locale::classic + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::locale::classic + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar1 + -0x18)) = 3;
  poVar2 = std::ostream::_M_insert<double>((double)_prof.mStart.__d.__r);
  poVar2 = std::operator<<(poVar2,"s");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void StdSprintf()
{
    char buf[64];
    PROFILING_BEGIN(T, "sprintf")
    sprintf(buf, PrintfFormat<T>(), i);
    PROFILING_END()
}